

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  FieldsByNumberMap *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __node_ptr p_Var4;
  __node_ptr p_Var5;
  __buckets_ptr pp_Var6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  size_type __bkt_count;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  __hash_code __c;
  undefined1 auVar11 [16];
  _Scoped_node local_58;
  pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>
  local_48;
  
  local_48.first.first = *(Descriptor **)(field + 0x58);
  local_48.first.second = *(int *)(field + 0x38);
  this_00 = &this->fields_by_number_;
  __c = (long)local_48.first.first * 0xffff + (long)local_48.first.second;
  uVar8 = __c % (this->fields_by_number_).
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ._M_h._M_bucket_count;
  local_48.second = field;
  p_Var4 = std::
           _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this_00,uVar8,&local_48.first,__c);
  if (p_Var4 == (__node_ptr)0x0) {
    p_Var5 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>,true>>>
             ::
             _M_allocate_node<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>,true>>>
                         *)this_00,&local_48);
    local_58._M_h = (__hashtable_alloc *)this_00;
    local_58._M_node = p_Var5;
    auVar11 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->fields_by_number_).
                                 super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                 ._M_h._M_rehash_policy,
                         (this->fields_by_number_).
                         super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         ._M_h._M_bucket_count,
                         (this->fields_by_number_).
                         super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         ._M_h._M_element_count);
    __bkt_count = auVar11._8_8_;
    if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var6 = (this_00->
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                )._M_h._M_buckets;
    }
    else {
      pp_Var6 = std::
                _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_allocate_buckets
                          ((_Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)this_00,__bkt_count);
      p_Var1 = &(this->fields_by_number_).
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ._M_h._M_before_begin;
      p_Var3 = (this->fields_by_number_).
               super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
               ._M_h._M_before_begin._M_nxt;
      (this->fields_by_number_).
      super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar8 = 0;
LAB_005b5d17:
      p_Var10 = p_Var3;
      uVar9 = uVar8;
      if (p_Var10 != (_Hash_node_base *)0x0) {
        p_Var3 = p_Var10->_M_nxt;
        uVar8 = (ulong)p_Var10[4]._M_nxt % __bkt_count;
        if (pp_Var6[uVar8] == (__node_base_ptr)0x0) goto LAB_005b5d48;
        p_Var10->_M_nxt = pp_Var6[uVar8]->_M_nxt;
        p_Var7 = pp_Var6[uVar8];
        uVar8 = uVar9;
        goto LAB_005b5d67;
      }
      std::
      _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00);
      (this->fields_by_number_).
      super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ._M_h._M_bucket_count = __bkt_count;
      (this->fields_by_number_).
      super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ._M_h._M_buckets = pp_Var6;
      uVar8 = __c % __bkt_count;
    }
    (p_Var5->
    super__Hash_node_value<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var6[uVar8] == (__node_base_ptr)0x0) {
      (p_Var5->super__Hash_node_base)._M_nxt =
           (this->fields_by_number_).
           super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
           ._M_h._M_before_begin._M_nxt;
      (this->fields_by_number_).
      super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ._M_h._M_before_begin._M_nxt = &p_Var5->super__Hash_node_base;
      p_Var3 = (p_Var5->super__Hash_node_base)._M_nxt;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        pp_Var6[(ulong)p_Var3[4]._M_nxt %
                (this->fields_by_number_).
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ._M_h._M_bucket_count] = &p_Var5->super__Hash_node_base;
        pp_Var6 = (this->fields_by_number_).
                  super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ._M_h._M_buckets;
      }
      pp_Var6[uVar8] =
           &(this->fields_by_number_).
            super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ._M_h._M_before_begin;
    }
    else {
      (p_Var5->super__Hash_node_base)._M_nxt = pp_Var6[uVar8]->_M_nxt;
      pp_Var6[uVar8]->_M_nxt = &p_Var5->super__Hash_node_base;
    }
    psVar2 = &(this->fields_by_number_).
              super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_58._M_node = (__node_ptr)0x0;
    std::
    _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node(&local_58);
  }
  return p_Var4 == (__node_ptr)0x0;
LAB_005b5d48:
  p_Var10->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = p_Var10;
  pp_Var6[uVar8] = p_Var1;
  if (p_Var10->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (__node_base_ptr)(pp_Var6 + uVar9);
LAB_005b5d67:
    p_Var7->_M_nxt = p_Var10;
  }
  goto LAB_005b5d17;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  return InsertIfNotPresent(&fields_by_number_, key, field);
}